

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

Point __thiscall MarkerIndex::get_node_position(MarkerIndex *this,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  iterator iVar3;
  Point *pPVar4;
  __hashtable *__h;
  Node *pNVar5;
  Point position;
  Point local_38;
  Node *local_30;
  Node *local_28;
  Point local_20;
  
  pPVar4 = &local_38;
  local_30 = node;
  iVar3 = std::
          _Hashtable<const_MarkerIndex::Node_*,_std::pair<const_MarkerIndex::Node_*const,_Point>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>,_std::__detail::_Select1st,_std::equal_to<const_MarkerIndex::Node_*>,_std::hash<const_MarkerIndex::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->node_position_cache)._M_h,&local_30);
  if (iVar3.super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>.
      _M_cur == (__node_type *)0x0) {
    local_20 = local_30->left_extent;
    local_38 = local_20;
    pNVar2 = local_30->parent;
    pNVar1 = local_30;
    while (pNVar5 = pNVar2, pNVar5 != (Node *)0x0) {
      if (pNVar5->right == pNVar1) {
        local_20 = Point::traverse(&pNVar5->left_extent,&local_38);
        pNVar5 = pNVar1->parent;
        local_38 = local_20;
      }
      pNVar1 = pNVar5;
      pNVar2 = pNVar5->parent;
    }
    local_28 = local_30;
    std::
    _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
              ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->node_position_cache);
  }
  else {
    pPVar4 = (Point *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>
                             ._M_cur + 0x10);
  }
  return *pPVar4;
}

Assistant:

Point MarkerIndex::get_node_position(const Node *node) const {
  auto cache_entry = node_position_cache.find(node);
  if (cache_entry == node_position_cache.end()) {
    Point position = node->left_extent;
    const Node *current_node = node;
    while (current_node->parent) {
      if (current_node->parent->right == current_node) {
        position = current_node->parent->left_extent.traverse(position);
      }

      current_node = current_node->parent;
    }
    node_position_cache.insert({node, position});
    return position;
  } else {
    return cache_entry->second;
  }
}